

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExpandReturning(Parse *pParse,ExprList *pList,Table *pTab)

{
  sqlite3 *db_00;
  int iVar1;
  Expr *pEVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  ExprList_item *pItem_1;
  Expr *pNewExpr_1;
  ExprList_item *pItem;
  Expr *pNewExpr;
  int jj;
  Expr *pOldExpr;
  int i;
  sqlite3 *db;
  ExprList *pNew;
  Table *pTab_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db = (sqlite3 *)0x0;
  db_00 = pParse->db;
  for (pOldExpr._4_4_ = 0; pOldExpr._4_4_ < pList->nExpr; pOldExpr._4_4_ = pOldExpr._4_4_ + 1) {
    pEVar2 = pList->a[pOldExpr._4_4_].pExpr;
    if (pEVar2 != (Expr *)0x0) {
      iVar1 = isAsteriskTerm(pParse,pEVar2);
      if (iVar1 == 0) {
        pEVar2 = sqlite3ExprDup(db_00,pEVar2,0);
        db = (sqlite3 *)sqlite3ExprListAppend(pParse,(ExprList *)db,pEVar2);
        if ((db_00->mallocFailed == '\0') && (pList->a[pOldExpr._4_4_].zEName != (char *)0x0)) {
          lVar4 = (long)(*(int *)&db->pVfs + -1);
          lVar5 = lVar4 * 0x18;
          pcVar3 = sqlite3DbStrDup(db_00,pList->a[pOldExpr._4_4_].zEName);
          *(char **)(db->aLimit + lVar4 * 6 + -0x1e) = pcVar3;
          *(ushort *)((long)db->aLimit + lVar5 + -0x6f) =
               *(ushort *)((long)db->aLimit + lVar5 + -0x6f) & 0xfffc |
               *(ushort *)&pList->a[pOldExpr._4_4_].fg.field_0x1 & 3;
        }
      }
      else {
        for (pNewExpr._4_4_ = 0; pNewExpr._4_4_ < pTab->nCol; pNewExpr._4_4_ = pNewExpr._4_4_ + 1) {
          if ((pTab->aCol[pNewExpr._4_4_].colFlags & 2) == 0) {
            pEVar2 = sqlite3Expr(db_00,0x3b,pTab->aCol[pNewExpr._4_4_].zCnName);
            db = (sqlite3 *)sqlite3ExprListAppend(pParse,(ExprList *)db,pEVar2);
            if (db_00->mallocFailed == '\0') {
              lVar4 = (long)(*(int *)&db->pVfs + -1);
              lVar5 = lVar4 * 0x18;
              pcVar3 = sqlite3DbStrDup(db_00,pTab->aCol[pNewExpr._4_4_].zCnName);
              *(char **)(db->aLimit + lVar4 * 6 + -0x1e) = pcVar3;
              *(ushort *)((long)db->aLimit + lVar5 + -0x6f) =
                   *(ushort *)((long)db->aLimit + lVar5 + -0x6f) & 0xfffc;
            }
          }
        }
      }
    }
  }
  return (ExprList *)db;
}

Assistant:

static ExprList *sqlite3ExpandReturning(
  Parse *pParse,        /* Parsing context */
  ExprList *pList,      /* The arguments to RETURNING */
  Table *pTab           /* The table being updated */
){
  ExprList *pNew = 0;
  sqlite3 *db = pParse->db;
  int i;

  for(i=0; i<pList->nExpr; i++){
    Expr *pOldExpr = pList->a[i].pExpr;
    if( NEVER(pOldExpr==0) ) continue;
    if( isAsteriskTerm(pParse, pOldExpr) ){
      int jj;
      for(jj=0; jj<pTab->nCol; jj++){
        Expr *pNewExpr;
        if( IsHiddenColumn(pTab->aCol+jj) ) continue;
        pNewExpr = sqlite3Expr(db, TK_ID, pTab->aCol[jj].zCnName);
        pNew = sqlite3ExprListAppend(pParse, pNew, pNewExpr);
        if( !db->mallocFailed ){
          struct ExprList_item *pItem = &pNew->a[pNew->nExpr-1];
          pItem->zEName = sqlite3DbStrDup(db, pTab->aCol[jj].zCnName);
          pItem->fg.eEName = ENAME_NAME;
        }
      }
    }else{
      Expr *pNewExpr = sqlite3ExprDup(db, pOldExpr, 0);
      pNew = sqlite3ExprListAppend(pParse, pNew, pNewExpr);
      if( !db->mallocFailed && ALWAYS(pList->a[i].zEName!=0) ){
        struct ExprList_item *pItem = &pNew->a[pNew->nExpr-1];
        pItem->zEName = sqlite3DbStrDup(db, pList->a[i].zEName);
        pItem->fg.eEName = pList->a[i].fg.eEName;
      }
    }
  }
  return pNew;
}